

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::VariableDimensionSyntax> *args_3;
  IntegerTypeSyntax *pIVar1;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::VariableDimensionSyntax>
                     ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)(__fn + 0x38),
                      (BumpAllocator *)__child_stack);
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::IntegerTypeSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,&local_30,&local_40,args_3);
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const IntegerTypeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<IntegerTypeSyntax>(
        node.kind,
        node.keyword.deepClone(alloc),
        node.signing.deepClone(alloc),
        *deepClone(node.dimensions, alloc)
    );
}